

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O2

int mbedtls_asn1_get_mpi(uchar **p,uchar *end,mbedtls_mpi *X)

{
  undefined4 in_EAX;
  int iVar1;
  undefined4 in_register_00000004;
  size_t local_28;
  size_t len;
  
  local_28 = CONCAT44(in_register_00000004,in_EAX);
  iVar1 = mbedtls_asn1_get_tag(p,end,&local_28,2);
  if (iVar1 == 0) {
    iVar1 = mbedtls_mpi_read_binary(X,*p,local_28);
    *p = *p + local_28;
  }
  return iVar1;
}

Assistant:

int mbedtls_asn1_get_mpi(unsigned char **p,
                         const unsigned char *end,
                         mbedtls_mpi *X)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len;

    if ((ret = mbedtls_asn1_get_tag(p, end, &len, MBEDTLS_ASN1_INTEGER)) != 0) {
        return ret;
    }

    ret = mbedtls_mpi_read_binary(X, *p, len);

    *p += len;

    return ret;
}